

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O2

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::string
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,string *s,color *c,float align_x,
          float align_y)

{
  ImU32 col;
  ImDrawList *this_00;
  ImVec2 IVar1;
  ImVec2 local_80;
  float local_78;
  float local_68;
  float local_58;
  float local_48;
  ImVec4 local_30;
  
  if ((0.0 < align_x) || (0.0 < align_y)) {
    local_78 = align_y;
    local_68 = align_x;
    local_58 = y;
    local_48 = x;
    IVar1 = ImGui::CalcTextSize((s->_M_dataplus)._M_p,(char *)0x0,false,-1.0);
    this_00 = this->draw_list;
    local_80.y = local_58 - local_78 * IVar1.y;
    local_80.x = local_48 - local_68 * IVar1.x;
  }
  else {
    this_00 = this->draw_list;
    local_80.y = y;
    local_80.x = x;
  }
  local_30.x = *c->r;
  local_30.y = *c->g;
  local_30.z = *c->b;
  local_30.w = *c->a;
  col = ImGui::ColorConvertFloat4ToU32(&local_30);
  ImDrawList::AddText(this_00,&local_80,col,(s->_M_dataplus)._M_p,(char *)0x0);
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::string(float x, float y,
                                          const std::string& s,
                                          const color::color& c, float align_x,
                                          float align_y) {
    // String using ImGui API
    if (align_x > 0. || align_y > 0.) {
        ImVec2 sz = ImGui::CalcTextSize(s.c_str());
        draw_list->AddText(ImVec2(x - align_x * sz.x, y - align_y * sz.y),
                           ImColor(c.r, c.g, c.b, c.a), s.c_str());
    } else {
        draw_list->AddText(ImVec2(x, y), ImColor(c.r, c.g, c.b, c.a),
                           s.c_str());
    }
}